

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O3

bool __thiscall
rek::Solver::hasConverged
          (Solver *this,SparseMatrix<double,_1,_int> *A,SparseMatrix<double,_0,_int> *AColMajor,
          RowVector *x,RowVector *b,RowVector *z,double tolerance)

{
  ulong uVar1;
  SparseMatrix<double,_0,_int> *pSVar2;
  undefined8 *puVar3;
  char *pcVar4;
  bool bVar5;
  LhsNested lhsNested;
  ulong uVar6;
  RhsNested rhsNested;
  double dVar7;
  RowVector zA;
  RowVector residual;
  Transpose<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> dstT;
  Matrix<double,__1,_1,_0,__1,_1> local_a8;
  Matrix<double,__1,_1,_0,__1,_1> local_98;
  double local_88;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_80;
  Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_70;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_68;
  Scalar local_30;
  
  local_88 = tolerance;
  if (A->m_innerSize !=
      (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pcVar4 = 
    "Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<double, 1>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
    ;
LAB_00105952:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar4);
  }
  uVar1 = A->m_outerSize;
  if (uVar1 != (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
  {
    pcVar4 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
LAB_001058c7:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar4);
  }
  local_68.m_lhs.m_lhs.m_lhs = A;
  local_68.m_lhs.m_lhs.m_rhs = x;
  local_68.m_lhs.m_rhs = b;
  local_68.m_rhs = z;
  if (uVar1 != (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
  {
    pcVar4 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_001058c7;
  }
  local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if ((long)uVar1 < 0) {
LAB_00105834:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pSVar2 = (SparseMatrix<double,_0,_int> *)
           local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (uVar1 != 0) {
    if (uVar1 >> 0x3d != 0) {
LAB_00105853:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = time;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pSVar2 = (SparseMatrix<double,_0,_int> *)malloc(uVar1 * 8);
    if (uVar1 != 1 && ((ulong)pSVar2 & 0xf) != 0) goto LAB_001058d1;
    if (pSVar2 == (SparseMatrix<double,_0,_int> *)0x0) goto LAB_00105853;
  }
  local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pSVar2;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar1;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
            (&local_98,&local_68,(assign_op<double,_double> *)&local_80);
  local_80.m_xpr = &local_98;
  if (local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0)
  {
    dVar7 = 0.0;
  }
  else {
    if (local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 1
       ) goto LAB_001058f0;
    local_68.m_lhs.m_lhs.m_lhs =
         (LhsNested)
         local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    dVar7 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
            ::
            run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&local_68,(scalar_sum_op<double,_double> *)&local_a8,&local_80);
  }
  if (local_88 <= SQRT(dVar7)) {
    bVar5 = false;
  }
  else {
    if ((z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        AColMajor->m_innerSize) {
      pcVar4 = 
      "Eigen::Product<Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::SparseMatrix<double>, Option = 0]"
      ;
      goto LAB_00105952;
    }
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    uVar1 = AColMajor->m_outerSize;
    if (uVar1 == 0) {
      uVar6 = 0;
      pSVar2 = (SparseMatrix<double,_0,_int> *)0x0;
      local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar1;
    }
    else {
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar1),0) < 1) {
LAB_0010590f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = time;
        __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if ((long)uVar1 < 0) goto LAB_00105834;
      if (uVar1 >> 0x3d != 0) goto LAB_0010590f;
      pSVar2 = (SparseMatrix<double,_0,_int> *)malloc(uVar1 * 8);
      if (uVar1 != 1 && ((ulong)pSVar2 & 0xf) != 0) {
LAB_001058d1:
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pSVar2 == (SparseMatrix<double,_0,_int> *)0x0) goto LAB_0010590f;
      uVar6 = uVar1 & 0x1ffffffffffffffe;
      local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)pSVar2;
      local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar1;
      if (uVar1 != 1) {
        memset(pSVar2,0,uVar6 * 8);
      }
    }
    if (uVar6 != uVar1) {
      memset(&pSVar2->super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> +
             (uVar1 << 3 & 0xfffffffffffffff0),0,(ulong)((uint)(uVar1 << 3) & 8));
    }
    local_30 = 1.0;
    local_68._0_1_ = 0;
    local_80.m_xpr = &local_a8;
    local_70.m_matrix.m_matrix = (non_const_type)(non_const_type)z;
    local_68.m_lhs.m_lhs.m_lhs = (LhsNested)AColMajor;
    Eigen::internal::
    sparse_time_dense_product_impl<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_double,_1,_true>
    ::run((Transpose<const_Eigen::SparseMatrix<double,_0,_int>_> *)&local_68,&local_70,
          (Transpose<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&local_80,
          &local_30);
    if (local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
        0) {
      dVar7 = 0.0;
      local_80.m_xpr = &local_a8;
    }
    else {
      local_80.m_xpr = &local_a8;
      if (local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          1) {
LAB_001058f0:
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                     );
      }
      local_68.m_lhs.m_lhs.m_lhs =
           (LhsNested)
           local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      local_80.m_xpr = &local_a8;
      dVar7 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
              ::
              run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)&local_68,(scalar_sum_op<double,_double> *)&local_70,&local_80);
    }
    bVar5 = SQRT(dVar7) < local_88;
    free(local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  free(local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return bVar5;
}

Assistant:

bool hasConverged(SparseMatrix<double, RowMajor> &A,
                    SparseMatrix<double, ColMajor> &AColMajor,
                    const RowVector &x, const RowVector &b, const RowVector &z,
                    double tolerance) const {
    const RowVector residual = A * x - b + z;
    const bool condOne = residual.norm() < tolerance;

    // Early return
    if (!condOne) return false;

    const RowVector zA = z.transpose() * AColMajor;
    return zA.norm() < tolerance;
  }